

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zet_nullddi.cpp
# Opt level: O1

ze_result_t driver::zetMetricStreamerClose(zet_metric_streamer_handle_t hMetricStreamer)

{
  ze_result_t zVar1;
  
  if (DAT_0010e890 != (code *)0x0) {
    zVar1 = (*DAT_0010e890)();
    return zVar1;
  }
  return ZE_RESULT_SUCCESS;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zetMetricStreamerClose(
        zet_metric_streamer_handle_t hMetricStreamer    ///< [in][release] handle of the metric streamer
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnClose = context.zetDdiTable.MetricStreamer.pfnClose;
        if( nullptr != pfnClose )
        {
            result = pfnClose( hMetricStreamer );
        }
        else
        {
            // generic implementation

        }

        return result;
    }